

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::PlotBarsHEx<ImPlot::GetterBarH<double>,double>
               (char *label_id,GetterBarH<double> *getter,double height)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  double *pdVar8;
  ImPlotPlot *pIVar9;
  double dVar10;
  double dVar11;
  ImPlotContext *pIVar12;
  bool bVar13;
  ImU32 col;
  ImU32 col_00;
  ImDrawList *this;
  int iVar14;
  int iVar15;
  ImPlotRange *pIVar16;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  ImVec2 b;
  ImVec2 a;
  ImVec2 local_40;
  ImVec2 local_38;
  
  bVar13 = BeginItem(label_id,1);
  pIVar12 = GImPlot;
  if (bVar13) {
    dVar23 = height * 0.5;
    if ((GImPlot->FitThisFrame == true) && (iVar14 = getter->Count, 0 < iVar14)) {
      pdVar8 = getter->Xs;
      iVar15 = getter->Offset;
      iVar4 = getter->Stride;
      dVar1 = getter->YShift;
      pIVar9 = GImPlot->CurrentPlot;
      iVar5 = pIVar9->CurrentYAxis;
      uVar6 = (pIVar9->XAxis).Flags;
      pIVar16 = GImPlot->ExtentsY + iVar5;
      uVar7 = pIVar9->YAxis[iVar5].Flags;
      iVar17 = 0;
      dVar20 = 0.0;
      do {
        dVar2 = *(double *)
                 ((long)pdVar8 +
                 (long)(((iVar15 + iVar17) % iVar14 + iVar14) % iVar14) * (long)iVar4);
        dVar21 = dVar1 + dVar20;
        dVar22 = dVar21 - dVar23;
        if ((uVar6 >> 10 & 1) == 0) {
          if ((uVar6 & 0x20) == 0) {
LAB_001f81f7:
            dVar10 = (pIVar12->ExtentsX).Min;
            dVar11 = (pIVar12->ExtentsX).Max;
            (pIVar12->ExtentsX).Min = (double)(-(ulong)(dVar10 <= 0.0) & (ulong)dVar10);
            (pIVar12->ExtentsX).Max = (double)(-(ulong)(0.0 <= dVar11) & (ulong)dVar11);
          }
        }
        else if ((((uVar6 & 0x20) == 0) && (pIVar9->YAxis[iVar5].Range.Min <= dVar22)) &&
                (dVar22 <= pIVar9->YAxis[iVar5].Range.Max)) goto LAB_001f81f7;
        if ((uVar7 >> 10 & 1) == 0) {
          if ((long)ABS(dVar22) < 0x7ff0000000000000) {
LAB_001f825b:
            if ((0.0 < dVar22) || ((uVar7 & 0x20) == 0)) {
              dVar10 = pIVar12->ExtentsY[iVar5].Max;
              uVar18 = -(ulong)(dVar22 < pIVar16->Min);
              uVar19 = -(ulong)(dVar10 < dVar22);
              pIVar16->Min = (double)(~uVar18 & (ulong)pIVar16->Min | (ulong)dVar22 & uVar18);
              pIVar12->ExtentsY[iVar5].Max =
                   (double)(~uVar19 & (ulong)dVar10 | (ulong)dVar22 & uVar19);
            }
          }
        }
        else if ((((long)ABS(dVar22) < 0x7ff0000000000000) && ((pIVar9->XAxis).Range.Min <= 0.0)) &&
                (0.0 <= (pIVar9->XAxis).Range.Max)) goto LAB_001f825b;
        dVar21 = dVar21 + dVar23;
        if ((uVar6 >> 10 & 1) == 0) {
          if ((ulong)ABS(dVar2) < 0x7ff0000000000000) {
LAB_001f82da:
            if ((0.0 < dVar2) || ((uVar6 & 0x20) == 0)) {
              dVar22 = (pIVar12->ExtentsX).Min;
              dVar10 = (pIVar12->ExtentsX).Max;
              uVar18 = -(ulong)(dVar2 < dVar22);
              uVar19 = -(ulong)(dVar10 < dVar2);
              (pIVar12->ExtentsX).Min = (double)(~uVar18 & (ulong)dVar22 | (ulong)dVar2 & uVar18);
              (pIVar12->ExtentsX).Max = (double)(~uVar19 & (ulong)dVar10 | (ulong)dVar2 & uVar19);
            }
          }
        }
        else if ((((ulong)ABS(dVar2) < 0x7ff0000000000000) &&
                 (pIVar9->YAxis[iVar5].Range.Min <= dVar21)) &&
                (dVar21 <= pIVar9->YAxis[iVar5].Range.Max)) goto LAB_001f82da;
        if ((uVar7 >> 10 & 1) == 0) {
          if ((long)ABS(dVar21) < 0x7ff0000000000000) {
LAB_001f835f:
            if ((0.0 < dVar21) || ((uVar7 & 0x20) == 0)) {
              dVar2 = pIVar12->ExtentsY[iVar5].Max;
              uVar18 = -(ulong)(dVar21 < pIVar16->Min);
              uVar19 = -(ulong)(dVar2 < dVar21);
              pIVar16->Min = (double)(~uVar18 & (ulong)pIVar16->Min | (ulong)dVar21 & uVar18);
              pIVar12->ExtentsY[iVar5].Max =
                   (double)(~uVar19 & (ulong)dVar2 | (ulong)dVar21 & uVar19);
            }
          }
        }
        else if ((((long)ABS(dVar21) < 0x7ff0000000000000) && ((pIVar9->XAxis).Range.Min <= dVar2))
                && (dVar2 <= (pIVar9->XAxis).Range.Max)) goto LAB_001f835f;
        dVar20 = dVar20 + 1.0;
        iVar17 = iVar17 + 1;
      } while (iVar14 != iVar17);
    }
    this = GetPlotDrawList();
    col = ImGui::GetColorU32((pIVar12->NextItemData).Colors);
    col_00 = ImGui::GetColorU32((pIVar12->NextItemData).Colors + 1);
    iVar14 = getter->Count;
    if (0 < iVar14) {
      bVar13 = (pIVar12->NextItemData).RenderFill;
      bVar3 = (pIVar12->NextItemData).RenderLine;
      iVar15 = 0;
      do {
        dVar1 = *(double *)
                 ((long)getter->Xs +
                 (long)(((getter->Offset + iVar15) % iVar14 + iVar14) % iVar14) *
                 (long)getter->Stride);
        if ((dVar1 != 0.0) || (NAN(dVar1))) {
          dVar20 = (double)iVar15 + getter->YShift;
          local_38 = PlotToPixels(0.0,dVar20 - dVar23,-1);
          local_40 = PlotToPixels(dVar1,dVar20 + dVar23,-1);
          if ((pIVar12->NextItemData).RenderFill == true) {
            ImDrawList::AddRectFilled(this,&local_38,&local_40,col_00,0.0,0);
          }
          if (((bVar13 ^ 1U | col != col_00) & bVar3) != 0) {
            ImDrawList::AddRect(this,&local_38,&local_40,col,0.0,0xf0,
                                (pIVar12->NextItemData).LineWeight);
          }
          iVar14 = getter->Count;
        }
        iVar15 = iVar15 + 1;
      } while (iVar15 < iVar14);
    }
    pIVar12 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar12->NextItemData);
    pIVar12->PreviousItem = pIVar12->CurrentItem;
    pIVar12->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

void PlotBarsHEx(const char* label_id, const Getter& getter, THeight height) {
    if (BeginItem(label_id, ImPlotCol_Fill)) {
        const THeight half_height = height / 2;
        if (FitThisFrame()) {
            for (int i = 0; i < getter.Count; ++i) {
                ImPlotPoint p = getter(i);
                FitPoint(ImPlotPoint(0, p.y - half_height));
                FitPoint(ImPlotPoint(p.x, p.y + half_height));
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        ImU32 col_line  = ImGui::GetColorU32(s.Colors[ImPlotCol_Line]);
        ImU32 col_fill  = ImGui::GetColorU32(s.Colors[ImPlotCol_Fill]);
        bool  rend_line = s.RenderLine;
        if (s.RenderFill && col_line == col_fill)
            rend_line = false;
        for (int i = 0; i < getter.Count; ++i) {
            ImPlotPoint p = getter(i);
            if (p.x == 0)
                continue;
            ImVec2 a = PlotToPixels(0, p.y - half_height);
            ImVec2 b = PlotToPixels(p.x, p.y + half_height);
            if (s.RenderFill)
                DrawList.AddRectFilled(a, b, col_fill);
            if (rend_line)
                DrawList.AddRect(a, b, col_line, 0, ImDrawFlags_RoundCornersAll, s.LineWeight);
        }
        EndItem();
    }
}